

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_while_statement_t::typed_while_statement_t
          (typed_while_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_expression_t> *cond,
          shared_ptr<const_tchecker::typed_statement_t> *stmt)

{
  shared_ptr<const_tchecker::statement_t> local_48;
  shared_ptr<const_tchecker::expression_t> local_38;
  shared_ptr<const_tchecker::typed_statement_t> *local_28;
  shared_ptr<const_tchecker::typed_statement_t> *stmt_local;
  shared_ptr<const_tchecker::typed_expression_t> *cond_local;
  typed_while_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_while_statement_t *this_local;
  
  local_28 = stmt;
  stmt_local = (shared_ptr<const_tchecker::typed_statement_t> *)cond;
  cond_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_00427aa8,cond_local._4_4_);
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::typed_expression_t_const,void>
            ((shared_ptr<tchecker::expression_t_const> *)&local_38,
             (shared_ptr<const_tchecker::typed_expression_t> *)stmt_local);
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::typed_statement_t_const,void>
            ((shared_ptr<tchecker::statement_t_const> *)&local_48,local_28);
  while_statement_t::while_statement_t
            (&this->super_while_statement_t,&PTR_construction_vtable_56__00427ab8,&local_38,
             &local_48);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr(&local_48);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x427a00;
  *(undefined8 *)&this->super_typed_statement_t = 0x427a00;
  *(undefined8 *)&this->super_while_statement_t = 0x427a70;
  return;
}

Assistant:

typed_while_statement_t::typed_while_statement_t(enum tchecker::statement_type_t type,
                                                 std::shared_ptr<tchecker::typed_expression_t const> const & cond,
                                                 std::shared_ptr<tchecker::typed_statement_t const> const & stmt)
    : tchecker::typed_statement_t(type), tchecker::while_statement_t(cond, stmt)
{
}